

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

UnknownField * __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::elements
          (RepeatedField<google::protobuf::UnknownField> *this,bool is_soo)

{
  ulong uVar1;
  int iVar2;
  UnknownField *pUVar3;
  string *psVar4;
  ThreadSafeArena *this_00;
  HeapRep *pHVar5;
  UnknownField *extraout_RAX;
  UnknownField *extraout_RAX_00;
  undefined7 in_register_00000031;
  LongSooRep *this_01;
  LongSooRep local_20;
  
  psVar4 = (string *)0x0;
  iVar2 = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar2 < 1) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar2,0,"Capacity(is_soo) > 0");
  }
  if (psVar4 == (string *)0x0) {
    if (is_soo) {
      return (UnknownField *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pUVar3 = (UnknownField *)internal::LongSooRep::elements((LongSooRep *)this);
    return pUVar3;
  }
  this_01 = &local_20;
  elements();
  uVar1 = this_01->elements_int;
  if ((uVar1 & 4) == 0) {
    this_00 = &internal::SooRep::soo_arena((SooRep *)this_01)->impl_;
  }
  else {
    pHVar5 = heap_rep((RepeatedField<google::protobuf::UnknownField> *)this_01);
    this_00 = &((pHVar5->field_0).arena)->impl_;
  }
  if (this_00 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated(this_00);
  }
  iVar2 = internal::SooRep::size((SooRep *)this_01,(uVar1 & 4) == 0);
  if (((uVar1 & 4) != 0) && (0 < iVar2)) {
    internal::LongSooRep::elements(this_01);
  }
  UnpoisonBuffer((RepeatedField<google::protobuf::UnknownField> *)this_01);
  pUVar3 = extraout_RAX;
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>((RepeatedField<google::protobuf::UnknownField> *)this_01);
    pUVar3 = extraout_RAX_00;
  }
  return pUVar3;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }